

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::alphaProductPlusY
          (HighsSparseMatrix *this,double alpha,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,bool transpose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  
  if (this->format_ == kColwise) {
    uVar1 = this->num_col_;
    if (transpose) {
      if (0 < (int)uVar1) {
        piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          iVar2 = piVar4[uVar9];
          lVar10 = (long)iVar2;
          iVar3 = piVar4[uVar9 + 1];
          if (iVar2 < iVar3) {
            dVar11 = pdVar8[uVar9];
            do {
              dVar11 = dVar11 + pdVar6[lVar10] * alpha * pdVar7[piVar5[lVar10]];
              pdVar8[uVar9] = dVar11;
              lVar10 = lVar10 + 1;
            } while (iVar3 != lVar10);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        iVar2 = piVar4[uVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[uVar9 + 1];
        if (iVar2 < iVar3) {
          do {
            iVar2 = piVar5[lVar10];
            pdVar8[iVar2] = pdVar6[lVar10] * alpha * pdVar7[uVar9] + pdVar8[iVar2];
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
  }
  else {
    uVar1 = this->num_row_;
    if (transpose) {
      if (0 < (int)uVar1) {
        piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          iVar2 = piVar4[uVar9];
          lVar10 = (long)iVar2;
          iVar3 = piVar4[uVar9 + 1];
          if (iVar2 < iVar3) {
            do {
              iVar2 = piVar5[lVar10];
              pdVar8[iVar2] = pdVar6[lVar10] * alpha * pdVar7[uVar9] + pdVar8[iVar2];
              lVar10 = lVar10 + 1;
            } while (iVar3 != lVar10);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      piVar4 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 0;
      do {
        iVar2 = piVar4[uVar9];
        lVar10 = (long)iVar2;
        iVar3 = piVar4[uVar9 + 1];
        if (iVar2 < iVar3) {
          dVar11 = pdVar8[uVar9];
          do {
            dVar11 = dVar11 + pdVar6[lVar10] * alpha * pdVar7[piVar5[lVar10]];
            pdVar8[uVar9] = dVar11;
            lVar10 = lVar10 + 1;
          } while (iVar3 != lVar10);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}